

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O0

void * mem_leak_operator_new_array(size_t size)

{
  MemoryLeakDetector *allocator;
  char *pcVar1;
  bad_alloc *this;
  void *memory;
  undefined1 in_stack_ffffffffffffffdf;
  size_t in_stack_ffffffffffffffe0;
  MemoryLeakDetector *in_stack_fffffffffffffff0;
  
  allocator = MemoryLeakWarningPlugin::getGlobalDetector();
  getCurrentNewArrayAllocator();
  pcVar1 = MemoryLeakDetector::allocMemory
                     (in_stack_fffffffffffffff0,(TestMemoryAllocator *)allocator,
                      in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
  if (pcVar1 == (char *)0x0) {
    this = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this);
    __cxa_throw(this,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return pcVar1;
}

Assistant:

UT_THROW(std::bad_alloc)
{
    void* memory = MemoryLeakWarningPlugin::getGlobalDetector()->allocMemory(getCurrentNewArrayAllocator(), size);
    UT_THROW_BAD_ALLOC_WHEN_NULL(memory);
    return memory;
}